

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

vm_prop_id_t __thiscall CTPNConst::gen_code_propid(CTPNConst *this,int check_only,int is_expr)

{
  tc_constval_type_t tVar1;
  uint uVar2;
  int in_ESI;
  long in_RDI;
  undefined2 local_2;
  
  tVar1 = CTcConstVal::get_type((CTcConstVal *)(in_RDI + 8));
  if (tVar1 == TC_CVT_PROP) {
    uVar2 = CTcConstVal::get_val_prop((CTcConstVal *)(in_RDI + 8));
    local_2 = (vm_prop_id_t)uVar2;
  }
  else {
    if (in_ESI == 0) {
      CTcTokenizer::log_error(0x2cfd);
    }
    local_2 = 0;
  }
  return local_2;
}

Assistant:

vm_prop_id_t CTPNConst::gen_code_propid(int check_only, int is_expr)
{
    /* check the type */
    switch(val_.get_type())
    {
    case TC_CVT_PROP:
        /* return the constant property ID */
        return (vm_prop_id_t)val_.get_val_prop();

    default:
        /* other values cannot be used as properties */
        if (!check_only)
            G_tok->log_error(TCERR_INVAL_PROP_EXPR);
        return VM_INVALID_PROP;
    }
}